

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O3

void __thiscall
ll_grammar::GrammarLeft::get_follow_by_first
          (GrammarLeft *this,int elemIndex,ExpressLeft *express,int begin,
          vector<int,_std::allocator<int>_> *result)

{
  bool bVar1;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __position;
  int index;
  ulong uVar5;
  vector<int,_std::allocator<int>_> tmp;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  piVar3 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4c = elemIndex;
  piVar2 = base_grammar::Express::operator[](&express->super_Express,0);
  if (*piVar2 == -1) {
    __position._M_current =
         (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_0010622e:
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)result,__position,&local_4c);
      goto LAB_0010623b;
    }
    *__position._M_current = elemIndex;
  }
  else {
    uVar5 = (ulong)begin;
    piVar3 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar4 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (uVar5 < (ulong)((long)piVar4 - (long)piVar3 >> 2)) {
      do {
        index = (int)uVar5;
        piVar2 = base_grammar::Express::operator[](&express->super_Express,index);
        bVar1 = public_tool::is_in_vector
                          ((this->first).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *piVar2,-1);
        if (!bVar1) {
          piVar2 = base_grammar::Express::operator[](&express->super_Express,index);
          public_tool::connect_vector
                    (result,(this->first).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + *piVar2);
          piVar3 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          break;
        }
        piVar2 = base_grammar::Express::operator[](&express->super_Express,index);
        clear_null((this->first).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *piVar2,&local_48,-1);
        public_tool::connect_vector(result,&local_48);
        uVar5 = uVar5 + 1;
        piVar3 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar4 = (express->super_Express).expression.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      } while (uVar5 < (ulong)((long)piVar4 - (long)piVar3 >> 2));
    }
    if ((long)piVar4 - (long)piVar3 >> 2 != uVar5) goto LAB_0010623b;
    __position._M_current =
         (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0010622e;
    *__position._M_current = local_4c;
  }
  (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = __position._M_current + 1;
LAB_0010623b:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GrammarLeft::get_follow_by_first(int elemIndex, ExpressLeft express, int begin, vector<int>& result){
    result.clear();
    vector<int> tmp;

    //如果是一个空串的话
    if (express[0] == -1){
        result.push_back(elemIndex);
        return;
    }

    for (begin=begin; begin < express.expression.size(); begin++){

        //如果空不在退出
        if (!is_in_vector(first[express[begin]], -1)){
            connect_vector(result, first[express[begin]]);
            break;
        }
        else
        {
            clear_null(first[express[begin]], tmp);
            connect_vector(result, tmp);
        }

    }
    if (begin == express.expression.size()){
        //result.push_back(-1);
        result.push_back(elemIndex);
    }

}